

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O2

iterator * __thiscall
first_fit_heap<128UL>::free_list_container::iterator::operator++(iterator *this)

{
  header_free *phVar1;
  undefined8 *puVar2;
  
  phVar1 = this->block->next_;
  this->block = phVar1;
  if ((phVar1 != (header_free *)0x0) && ((phVar1->super_header_used).canary != 0x1337133713371337))
  {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = &__cxxabiv1::__si_class_type_info::vtable;
    __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
  }
  return this;
}

Assistant:

iterator &operator++()
            {
                block = block->next();
                ASSERT_HEAP(block ? block->canary_alive() : true);
                return *this;
            }